

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall t_d_generator::generate_service(t_d_generator *this,t_service *tservice)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ostream *poVar6;
  t_program *ptVar7;
  undefined4 extraout_var_00;
  t_service *ptVar8;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pptVar10;
  t_struct *ptVar11;
  members_type *pmVar12;
  string *psVar13;
  reference pptVar14;
  t_type *ptVar15;
  undefined4 extraout_var_03;
  ulong uVar16;
  int __oflag;
  int __oflag_00;
  pair<std::_Rb_tree_const_iterator<t_type_*>,_bool> pVar17;
  allocator local_a39;
  string local_a38 [32];
  undefined1 local_a18 [8];
  ofstream_with_content_based_conditional_update f_skeleton;
  undefined1 local_858 [8];
  string f_skeletonname;
  string local_818;
  string local_7f8 [8];
  string meta_str;
  string local_7b8;
  string local_798;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_778
  ;
  t_field **local_770;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_768
  ;
  const_iterator ex_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *exceptions_1;
  undefined1 local_750 [7];
  bool first_2;
  string local_730;
  t_const_value *local_710;
  t_const_value *cv;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_6e8
  ;
  t_field **local_6e0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_6d8
  ;
  const_iterator p_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *params;
  undefined1 local_6c0 [7];
  bool first_1;
  string local_6a0;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_680;
  t_function **local_678;
  byte local_669;
  undefined1 local_668 [7];
  bool first;
  ostringstream meta;
  _Self local_4d0;
  _Base_ptr local_4c8;
  _Rb_tree_const_iterator<t_type_*> local_4c0;
  const_iterator et_iter;
  t_type *local_4a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_4a0
  ;
  t_field **local_498;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_490
  ;
  const_iterator ex_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *exceptions;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_460;
  t_function **local_458;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_450;
  iterator fn_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> exception_types;
  string local_3e0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator local_379;
  string local_378 [8];
  string extends;
  string local_338;
  string local_318;
  t_service *local_2f8;
  t_service *extends_service;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  undefined1 local_228 [8];
  ofstream_with_content_based_conditional_update f_service;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string f_servicename;
  string svc_name;
  t_service *tservice_local;
  t_d_generator *this_local;
  
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  psVar13 = (string *)((long)&f_servicename.field_2 + 8);
  suffix_if_reserved(psVar13,(string *)CONCAT44(extraout_var,iVar3));
  std::operator+(&local_78,&this->package_dir_,psVar13);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,".d");
  std::__cxx11::string::~string((string *)&local_78);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_228);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,pcVar5,&local_249);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_228,(char *)local_248,__oflag);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_270);
  poVar6 = std::operator<<((ostream *)local_228,local_270);
  poVar6 = std::operator<<(poVar6,"module ");
  render_package_abi_cxx11_
            (&local_2b0,this,(this->super_t_oop_generator).super_t_generator.program_);
  suffix_if_reserved(&local_290,&local_2b0);
  poVar6 = std::operator<<(poVar6,(string *)&local_290);
  poVar6 = std::operator<<(poVar6,(string *)(f_servicename.field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6,";");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string(local_270);
  print_default_imports(this,(ostream *)local_228);
  poVar6 = std::operator<<((ostream *)local_228,"import ");
  ptVar7 = t_generator::get_program((t_generator *)this);
  render_package_abi_cxx11_((string *)&extends_service,this,ptVar7);
  suffix_if_reserved(&local_2d0,(string *)&extends_service);
  poVar6 = std::operator<<(poVar6,(string *)&local_2d0);
  poVar6 = std::operator<<(poVar6,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar6 = std::operator<<(poVar6,"_types;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&extends_service);
  local_2f8 = t_service::get_extends(tservice);
  if (local_2f8 != (t_service *)0x0) {
    poVar6 = std::operator<<((ostream *)local_228,"import ");
    ptVar7 = t_type::get_program(&local_2f8->super_t_type);
    render_package_abi_cxx11_(&local_338,this,ptVar7);
    suffix_if_reserved(&local_318,&local_338);
    poVar6 = std::operator<<(poVar6,(string *)&local_318);
    iVar3 = (*(local_2f8->super_t_type).super_t_doc._vptr_t_doc[3])();
    suffix_if_reserved((string *)((long)&extends.field_2 + 8),
                       (string *)CONCAT44(extraout_var_00,iVar3));
    poVar6 = std::operator<<(poVar6,(string *)(extends.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(extends.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
  }
  std::operator<<((ostream *)local_228,(string *)&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"",&local_379);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  ptVar8 = t_service::get_extends(tservice);
  if (ptVar8 != (t_service *)0x0) {
    ptVar8 = t_service::get_extends(tservice);
    render_type_name_abi_cxx11_(&local_3e0,this,&ptVar8->super_t_type,false);
    suffix_if_reserved(&local_3c0,&local_3e0);
    std::operator+(&local_3a0," : ",&local_3c0);
    std::__cxx11::string::operator=(local_378,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  emit_doc(this,(t_doc *)tservice,(ostream *)local_228);
  t_generator::indent_abi_cxx11_
            ((string *)&exception_types._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (t_generator *)this);
  poVar6 = std::operator<<((ostream *)local_228,
                           (string *)
                           &exception_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
  poVar6 = std::operator<<(poVar6,"interface ");
  poVar6 = std::operator<<(poVar6,(string *)(f_servicename.field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6,local_378);
  poVar6 = std::operator<<(poVar6," {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)&exception_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
  t_generator::indent_up((t_generator *)this);
  std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::set
            ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_450);
  local_458 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  local_450._M_current = local_458;
  while( true ) {
    local_460._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
    bVar1 = __gnu_cxx::operator!=(&local_450,&local_460);
    if (!bVar1) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_450);
    emit_doc(this,&(*pptVar10)->super_t_doc,(ostream *)local_228);
    t_generator::indent_abi_cxx11_((string *)&exceptions,(t_generator *)this);
    std::operator<<((ostream *)local_228,(string *)&exceptions);
    std::__cxx11::string::~string((string *)&exceptions);
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_450);
    print_function_signature(this,(ostream *)local_228,*pptVar10);
    poVar6 = std::operator<<((ostream *)local_228,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_450);
    ptVar11 = t_function::get_xceptions(*pptVar10);
    ex_iter._M_current = (t_field **)t_struct::get_members(ptVar11);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_490);
    local_498 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(ex_iter._M_current);
    local_490._M_current = local_498;
    while( true ) {
      local_4a0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(ex_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_490,&local_4a0);
      if (!bVar1) break;
      pptVar14 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_490);
      local_4a8 = t_field::get_type(*pptVar14);
      pVar17 = std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::insert
                         ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
                          &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4a8);
      et_iter._M_node = (_Base_ptr)pVar17.first._M_node;
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_490);
    }
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_450);
  }
  bVar1 = std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::empty
                    ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
                     &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::operator<<((ostream *)local_228,(string *)&::endl_abi_cxx11_);
  }
  std::_Rb_tree_const_iterator<t_type_*>::_Rb_tree_const_iterator(&local_4c0);
  local_4c8 = (_Base_ptr)
              std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::begin
                        ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
                         &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_4c0._M_node = local_4c8;
  while( true ) {
    local_4d0._M_node =
         (_Base_ptr)
         std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::end
                   ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
                    &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::operator!=(&local_4c0,&local_4d0);
    if (!bVar1) break;
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_228);
    poVar6 = std::operator<<(poVar6,"alias ");
    pptVar9 = std::_Rb_tree_const_iterator<t_type_*>::operator*(&local_4c0);
    ptVar7 = t_type::get_program(*pptVar9);
    render_package_abi_cxx11_((string *)&meta.field_0x170,this,ptVar7);
    poVar6 = std::operator<<(poVar6,(string *)&meta.field_0x170);
    pptVar9 = std::_Rb_tree_const_iterator<t_type_*>::operator*(&local_4c0);
    ptVar7 = t_type::get_program(*pptVar9);
    psVar13 = t_program::get_name_abi_cxx11_(ptVar7);
    poVar6 = std::operator<<(poVar6,(string *)psVar13);
    poVar6 = std::operator<<(poVar6,"_types");
    poVar6 = std::operator<<(poVar6,".");
    pptVar9 = std::_Rb_tree_const_iterator<t_type_*>::operator*(&local_4c0);
    iVar3 = (*((*pptVar9)->super_t_doc)._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar6 = std::operator<<(poVar6," ");
    pptVar9 = std::_Rb_tree_const_iterator<t_type_*>::operator*(&local_4c0);
    iVar3 = (*((*pptVar9)->super_t_doc)._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_02,iVar3));
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&meta.field_0x170);
    std::_Rb_tree_const_iterator<t_type_*>::operator++(&local_4c0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
  t_generator::indent_up((t_generator *)this);
  local_669 = 1;
  local_678 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  local_450._M_current = local_678;
  do {
    local_680._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
    bVar1 = __gnu_cxx::operator!=(&local_450,&local_680);
    if (!bVar1) {
      t_generator::indent_down((t_generator *)this);
      std::__cxx11::ostringstream::str();
      uVar16 = std::__cxx11::string::empty();
      if ((uVar16 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)local_228,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_818,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_818);
        poVar6 = std::operator<<(poVar6,"enum methodMeta = [");
        poVar6 = std::operator<<(poVar6,local_7f8);
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_
                  ((string *)((long)&f_skeletonname.field_2 + 8),(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)(f_skeletonname.field_2._M_local_buf + 8));
        poVar6 = std::operator<<(poVar6,"];");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(f_skeletonname.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_818);
      }
      t_generator::indent_down((t_generator *)this);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_228);
      poVar6 = std::operator<<(poVar6,"}");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &f_skeleton.field_0x198,&this->package_dir_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&f_servicename.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_858,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &f_skeleton.field_0x198,"_server.skeleton.d");
      std::__cxx11::string::~string((string *)&f_skeleton.field_0x198);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      template_ofstream_with_content_based_conditional_update
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_a18);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a38,pcVar5,&local_a39);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_a18,(char *)local_a38,__oflag_00);
      std::__cxx11::string::~string(local_a38);
      std::allocator<char>::~allocator((allocator<char> *)&local_a39);
      poVar6 = (ostream *)local_a18;
      print_server_skeleton(this,poVar6,tservice);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_a18,(int)poVar6);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      ~template_ofstream_with_content_based_conditional_update
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_a18);
      std::__cxx11::string::~string((string *)local_858);
      std::__cxx11::string::~string(local_7f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
      std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
                ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
      std::set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_>::~set
                ((set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> *)
                 &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_378);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      ~template_ofstream_with_content_based_conditional_update
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_228);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)(f_servicename.field_2._M_local_buf + 8));
      return;
    }
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_450);
    ptVar11 = t_function::get_arglist(*pptVar10);
    pmVar12 = t_struct::get_members(ptVar11);
    bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(pmVar12);
    if (bVar1) {
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      ptVar11 = t_function::get_xceptions(*pptVar10);
      pmVar12 = t_struct::get_members(ptVar11);
      bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(pmVar12);
      if (!bVar1) goto LAB_002396d9;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      bVar1 = t_function::is_oneway(*pptVar10);
      if (bVar1) goto LAB_002396d9;
    }
    else {
LAB_002396d9:
      if ((local_669 & 1) == 0) {
        std::operator<<((ostream *)local_668,",");
      }
      else {
        local_669 = 0;
      }
      poVar6 = std::operator<<((ostream *)local_668,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6a0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_6a0);
      poVar6 = std::operator<<(poVar6,"TMethodMeta(`");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      psVar13 = t_function::get_name_abi_cxx11_(*pptVar10);
      suffix_if_reserved((string *)local_6c0,psVar13);
      poVar6 = std::operator<<(poVar6,(string *)local_6c0);
      poVar6 = std::operator<<(poVar6,"`, ");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_6c0);
      std::__cxx11::string::~string((string *)&local_6a0);
      t_generator::indent_up((t_generator *)this);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_668);
      std::operator<<(poVar6,"[");
      bVar1 = true;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      ptVar11 = t_function::get_arglist(*pptVar10);
      p_iter._M_current = (t_field **)t_struct::get_members(ptVar11);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_6d8);
      local_6e0 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(p_iter._M_current);
      local_6d8._M_current = local_6e0;
      while( true ) {
        local_6e8._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(p_iter._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_6d8,&local_6e8);
        if (!bVar2) break;
        if (bVar1) {
          bVar1 = false;
        }
        else {
          std::operator<<((ostream *)local_668,", ");
        }
        poVar6 = std::operator<<((ostream *)local_668,"TParamMeta(`");
        pptVar14 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6d8);
        psVar13 = t_field::get_name_abi_cxx11_(*pptVar14);
        suffix_if_reserved((string *)&cv,psVar13);
        poVar6 = std::operator<<(poVar6,(string *)&cv);
        poVar6 = std::operator<<(poVar6,"`, ");
        pptVar14 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6d8);
        iVar4 = t_field::get_key(*pptVar14);
        std::ostream::operator<<(poVar6,iVar4);
        std::__cxx11::string::~string((string *)&cv);
        pptVar14 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_6d8);
        local_710 = t_field::get_value(*pptVar14);
        if (local_710 != (t_const_value *)0x0) {
          poVar6 = std::operator<<((ostream *)local_668,", q{");
          pptVar14 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_6d8);
          ptVar15 = t_field::get_type(*pptVar14);
          render_const_value_abi_cxx11_(&local_730,this,ptVar15,local_710);
          poVar6 = std::operator<<(poVar6,(string *)&local_730);
          std::operator<<(poVar6,"}");
          std::__cxx11::string::~string((string *)&local_730);
        }
        std::operator<<((ostream *)local_668,")");
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_6d8);
      }
      std::operator<<((ostream *)local_668,"]");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      ptVar11 = t_function::get_xceptions(*pptVar10);
      pmVar12 = t_struct::get_members(ptVar11);
      bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(pmVar12);
      if (bVar1) {
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                   ::operator*(&local_450);
        bVar1 = t_function::is_oneway(*pptVar10);
        if (bVar1) goto LAB_00239b6b;
      }
      else {
LAB_00239b6b:
        poVar6 = std::operator<<((ostream *)local_668,",");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)local_750,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)local_750);
        std::operator<<(poVar6,"[");
        std::__cxx11::string::~string((string *)local_750);
        bVar1 = true;
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                   ::operator*(&local_450);
        ptVar11 = t_function::get_xceptions(*pptVar10);
        ex_iter_1._M_current = (t_field **)t_struct::get_members(ptVar11);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator(&local_768);
        local_770 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(ex_iter_1._M_current);
        local_768._M_current = local_770;
        while( true ) {
          local_778._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end(ex_iter_1._M_current);
          bVar2 = __gnu_cxx::operator!=(&local_768,&local_778);
          if (!bVar2) break;
          if (bVar1) {
            bVar1 = false;
          }
          else {
            std::operator<<((ostream *)local_668,", ");
          }
          poVar6 = std::operator<<((ostream *)local_668,"TExceptionMeta(`");
          pptVar14 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_768);
          psVar13 = t_field::get_name_abi_cxx11_(*pptVar14);
          suffix_if_reserved(&local_798,psVar13);
          poVar6 = std::operator<<(poVar6,(string *)&local_798);
          poVar6 = std::operator<<(poVar6,"`, ");
          pptVar14 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_768);
          iVar4 = t_field::get_key(*pptVar14);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,", `");
          pptVar14 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_768);
          ptVar15 = t_field::get_type(*pptVar14);
          iVar3 = (*(ptVar15->super_t_doc)._vptr_t_doc[3])();
          poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_03,iVar3));
          std::operator<<(poVar6,"`)");
          std::__cxx11::string::~string((string *)&local_798);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_768);
        }
        std::operator<<((ostream *)local_668,"]");
      }
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*(&local_450);
      bVar1 = t_function::is_oneway(*pptVar10);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)local_668,",");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_7b8,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_7b8);
        std::operator<<(poVar6,"TMethodType.ONEWAY");
        std::__cxx11::string::~string((string *)&local_7b8);
      }
      t_generator::indent_down((t_generator *)this);
      poVar6 = std::operator<<((ostream *)local_668,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)((long)&meta_str.field_2 + 8),(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)(meta_str.field_2._M_local_buf + 8));
      std::operator<<(poVar6,")");
      std::__cxx11::string::~string((string *)(meta_str.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_450);
  } while( true );
}

Assistant:

void generate_service(t_service* tservice) override {
    string svc_name = suffix_if_reserved(tservice->get_name());

    // Service implementation file includes
    string f_servicename = package_dir_ + svc_name + ".d";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_servicename.c_str());
    f_service << autogen_comment() << "module " << suffix_if_reserved(render_package(*program_)) << svc_name << ";"
              << endl << endl;

    print_default_imports(f_service);

    f_service << "import " << suffix_if_reserved(render_package(*get_program())) << program_name_ << "_types;" << endl;

    t_service* extends_service = tservice->get_extends();
    if (extends_service != nullptr) {
      f_service << "import " << suffix_if_reserved(render_package(*(extends_service->get_program())))
                << suffix_if_reserved(extends_service->get_name()) << ";" << endl;
    }

    f_service << endl;

    string extends = "";
    if (tservice->get_extends() != nullptr) {
      extends = " : " + suffix_if_reserved(render_type_name(tservice->get_extends()));
    }

    this->emit_doc(tservice, f_service);
    f_service << indent() << "interface " << svc_name << extends << " {" << endl;
    indent_up();

    // Collect all the exception types service methods can throw so we can
    // emit the necessary aliases later.
    set<t_type*> exception_types;

    // Print the method signatures.
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator fn_iter;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      this->emit_doc(*fn_iter, f_service);
      f_service << indent();
      print_function_signature(f_service, *fn_iter);
      f_service << ";" << endl;

      const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
      vector<t_field*>::const_iterator ex_iter;
      for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
        exception_types.insert((*ex_iter)->get_type());
      }
    }

    // Alias the exception types into the current scope.
    if (!exception_types.empty())
      f_service << endl;
    set<t_type*>::const_iterator et_iter;
    for (et_iter = exception_types.begin(); et_iter != exception_types.end(); ++et_iter) {
      indent(f_service) << "alias " << render_package(*(*et_iter)->get_program())
                        << (*et_iter)->get_program()->get_name() << "_types"
                        << "." << (*et_iter)->get_name() << " " << (*et_iter)->get_name() << ";"
                        << endl;
    }

    // Write the method metadata.
    ostringstream meta;
    indent_up();
    bool first = true;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      if ((*fn_iter)->get_arglist()->get_members().empty()
          && (*fn_iter)->get_xceptions()->get_members().empty() && !(*fn_iter)->is_oneway()) {
        continue;
      }

      if (first) {
        first = false;
      } else {
        meta << ",";
      }

      meta << endl << indent() << "TMethodMeta(`" << suffix_if_reserved((*fn_iter)->get_name()) << "`, " << endl;
      indent_up();
      indent(meta) << "[";

      bool first = true;
      const vector<t_field*>& params = (*fn_iter)->get_arglist()->get_members();
      vector<t_field*>::const_iterator p_iter;
      for (p_iter = params.begin(); p_iter != params.end(); ++p_iter) {
        if (first) {
          first = false;
        } else {
          meta << ", ";
        }

        meta << "TParamMeta(`" << suffix_if_reserved((*p_iter)->get_name()) << "`, " << (*p_iter)->get_key();

        t_const_value* cv = (*p_iter)->get_value();
        if (cv != nullptr) {
          meta << ", q{" << render_const_value((*p_iter)->get_type(), cv) << "}";
        }
        meta << ")";
      }

      meta << "]";

      if (!(*fn_iter)->get_xceptions()->get_members().empty() || (*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "[";

        bool first = true;
        const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator ex_iter;
        for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
          if (first) {
            first = false;
          } else {
            meta << ", ";
          }

          meta << "TExceptionMeta(`" << suffix_if_reserved((*ex_iter)->get_name()) << "`, "
               << (*ex_iter)->get_key() << ", `" << (*ex_iter)->get_type()->get_name() << "`)";
        }

        meta << "]";
      }

      if ((*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "TMethodType.ONEWAY";
      }

      indent_down();
      meta << endl << indent() << ")";
    }
    indent_down();

    string meta_str(meta.str());
    if (!meta_str.empty()) {
      f_service << endl << indent() << "enum methodMeta = [" << meta_str << endl << indent() << "];"
                << endl;
    }

    indent_down();
    indent(f_service) << "}" << endl;

    // Server skeleton generation.
    string f_skeletonname = package_dir_ + svc_name + "_server.skeleton.d";
    ofstream_with_content_based_conditional_update f_skeleton;
    f_skeleton.open(f_skeletonname.c_str());
    print_server_skeleton(f_skeleton, tservice);
    f_skeleton.close();
  }